

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O3

void __thiscall Assimp::LWOImporter::LWOImporter(LWOImporter *this)

{
  BaseImporter::BaseImporter(&this->super_BaseImporter);
  (this->super_BaseImporter)._vptr_BaseImporter = (_func_int **)&PTR_UpdateImporterScale_00877c28;
  this->mIsLWO2 = false;
  this->mIsLXOB = false;
  this->pScene = (aiScene *)0x0;
  this->configSpeedFlag = false;
  this->configLayerIndex = 0;
  this->mLayers = (LayerList *)0x0;
  this->mCurLayer = (Layer *)0x0;
  this->mTags = (TagList *)0x0;
  this->mMapping = (TagMappingTable *)0x0;
  this->mSurfaces = (SurfaceList *)0x0;
  (this->mClips).super__Vector_base<Assimp::LWO::Clip,_std::allocator<Assimp::LWO::Clip>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mClips).super__Vector_base<Assimp::LWO::Clip,_std::allocator<Assimp::LWO::Clip>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mClips).super__Vector_base<Assimp::LWO::Clip,_std::allocator<Assimp::LWO::Clip>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mEnvelopes).
  super__Vector_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mEnvelopes).
  super__Vector_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mEnvelopes).
  super__Vector_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->mFileBuffer = (uint8_t *)0x0;
  this->fileSize = 0;
  (this->configLayerName)._M_dataplus._M_p = (pointer)&(this->configLayerName).field_2;
  (this->configLayerName)._M_string_length = 0;
  (this->configLayerName).field_2._M_local_buf[0] = '\0';
  this->hasNamedLayer = false;
  return;
}

Assistant:

LWOImporter::LWOImporter()
    : mIsLWO2(),
    mIsLXOB(),
    mLayers(),
    mCurLayer(),
    mTags(),
    mMapping(),
    mSurfaces(),
    mFileBuffer(),
    fileSize(),
    pScene(),
    configSpeedFlag(),
    configLayerIndex(),
    hasNamedLayer()
{}